

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

natwm_error client_unmap_window(natwm_state *state,xcb_window_t window)

{
  workspace *workspace;
  client *pcVar1;
  natwm_error nVar2;
  
  workspace = workspace_list_find_window_workspace(state->workspace_list,window);
  nVar2 = NO_ERROR;
  if (workspace != (workspace *)0x0) {
    pcVar1 = workspace_find_window_client(workspace,window);
    if (pcVar1 == (client *)0x0) {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find registered client during unmap");
      nVar2 = NOT_FOUND_ERROR;
    }
    else {
      if ((pcVar1->state & CLIENT_OFF_SCREEN) == 0) {
        pcVar1->state = pcVar1->state | CLIENT_HIDDEN;
      }
      if (pcVar1->is_focused == true) {
        workspace_reset_focus(state,workspace);
      }
    }
  }
  return nVar2;
}

Assistant:

enum natwm_error client_unmap_window(struct natwm_state *state, xcb_window_t window)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, window);

        if (workspace == NULL) {
                // We do not have this window in our registry
                return NO_ERROR;
        }

        struct client *client = workspace_find_window_client(workspace, window);

        if (client == NULL) {
                LOG_ERROR(natwm_logger, "Failed to find registered client during unmap");

                return NOT_FOUND_ERROR;
        }

        if (!(client->state & CLIENT_OFF_SCREEN)) {
                client->state |= CLIENT_HIDDEN;
        }

        if (client->is_focused) {
                workspace_reset_focus(state, workspace);
        }

        return NO_ERROR;
}